

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump2.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  long lVar2;
  size_type sVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  uint64_t uVar9;
  ulong uVar10;
  long lVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  uint uVar12;
  long lVar13;
  long *plVar14;
  bool bVar15;
  filehandle f;
  string srcFilename;
  string dstFilename;
  undefined1 local_139;
  undefined1 local_138 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_130;
  char *local_128;
  char *pcStack_120;
  undefined2 local_118;
  int64_t local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  Hexdumper<unsigned_char> local_e8;
  _Storage<long,_true> local_d8;
  undefined1 local_d0;
  int64_t local_c8;
  undefined1 local_c0;
  int64_t local_b8;
  undefined1 local_b0;
  int64_t local_a8;
  undefined1 local_a0;
  uint64_t local_98;
  char local_90;
  int local_88;
  undefined4 local_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined1 local_74;
  undefined4 local_70;
  char local_6c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  int local_44;
  long local_40;
  long local_38;
  
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_d0 = 0;
  local_c0 = 0;
  local_b0 = 0;
  local_a0 = 0;
  local_90 = '\0';
  local_88 = 1;
  local_84 = 0;
  uStack_80 = 0;
  uStack_7c = 0;
  uStack_78 = 0;
  local_74 = 1;
  local_6c = '\0';
  _Stack_130._M_pi._4_4_ = 1;
  _Stack_130._M_pi._0_4_ = argc;
  local_118._0_1_ = false;
  local_118._1_1_ = false;
  local_138 = (undefined1  [8])argv;
  if (argc != 1) {
    local_128 = argv[1];
    cVar1 = *local_128;
    pcStack_120 = local_128;
    while (cVar1 != '\0') {
      cVar1 = pcStack_120[1];
      pcStack_120 = pcStack_120 + 1;
    }
    local_110 = 0;
    iVar6 = 0;
    do {
      iVar4 = ArgParser::ArgIterator::option((ArgIterator *)local_138);
      switch(iVar4) {
      case 0x65:
        local_c8 = ArgParser::ArgIterator::getint((ArgIterator *)local_138);
        local_c0 = 1;
        break;
      case 0x66:
        local_74 = 0;
        break;
      case 0x67:
      case 0x68:
      case 0x69:
      case 0x6a:
      case 0x6b:
      case 0x6d:
      case 0x6e:
      case 0x71:
      case 0x72:
      case 0x74:
      case 0x75:
      case 0x76:
        goto switchD_001025cb_caseD_67;
      case 0x6c:
        local_b8 = ArgParser::ArgIterator::getint((ArgIterator *)local_138);
        local_b0 = 1;
        break;
      case 0x6f:
        local_d8._M_value = ArgParser::ArgIterator::getint((ArgIterator *)local_138);
        local_d0 = 1;
        break;
      case 0x70:
        local_110 = ArgParser::ArgIterator::getint((ArgIterator *)local_138);
        break;
      case 0x73:
        uVar9 = ArgParser::ArgIterator::getuint((ArgIterator *)local_138);
        uStack_80 = (undefined4)uVar9;
        uStack_7c = (undefined4)(uVar9 >> 0x20);
        break;
      case 0x77:
        uVar9 = ArgParser::ArgIterator::getuint((ArgIterator *)local_138);
        local_84 = (undefined4)uVar9;
        break;
      case 0x78:
        iVar4 = ArgParser::ArgIterator::count((ArgIterator *)local_138);
        if (iVar4 == 2) {
          uStack_78 = 2;
        }
        else {
          uStack_78 = 1;
        }
        break;
      default:
        uVar10 = (ulong)(iVar4 - 0x31U);
        if (iVar4 - 0x31U < 0x32) {
          if ((0x8bUL >> (uVar10 & 0x3f) & 1) == 0) {
            if (uVar10 == 0x22) {
              uVar9 = ArgParser::ArgIterator::getuint((ArgIterator *)local_138);
              if (local_6c == '\0') {
                local_6c = '\x01';
              }
              local_70 = (undefined4)uVar9;
            }
            else {
              if (uVar10 != 0x31) goto LAB_00102641;
              local_a8 = ArgParser::ArgIterator::getint((ArgIterator *)local_138);
              local_a0 = 1;
            }
          }
          else {
            local_88 = ArgParser::ArgIterator::option((ArgIterator *)local_138);
            local_88 = local_88 + -0x30;
          }
        }
        else {
LAB_00102641:
          if (iVar4 != -1) goto switchD_001025cb_caseD_67;
          if (iVar6 == 1) {
            pcVar7 = ArgParser::ArgIterator::getstr((ArgIterator *)local_138);
            sVar3 = local_68._M_string_length;
            sVar8 = strlen(pcVar7);
            iVar6 = 2;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_replace(&local_68,0,sVar3,pcVar7,sVar8);
          }
          else if (iVar6 == 0) {
            pcVar7 = ArgParser::ArgIterator::getstr((ArgIterator *)local_138);
            sVar3 = local_108._M_string_length;
            sVar8 = strlen(pcVar7);
            iVar6 = 1;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_replace(&local_108,0,sVar3,pcVar7,sVar8);
          }
          else {
            iVar6 = iVar6 + 1;
          }
        }
      }
      iVar4 = _Stack_130._M_pi._4_4_;
      if (_Stack_130._M_pi._4_4_ == (int)_Stack_130._M_pi) {
        bVar15 = local_128 != (char *)0x0;
        iVar5 = _Stack_130._M_pi._4_4_;
      }
      else {
        iVar5 = _Stack_130._M_pi._4_4_ + 1;
        _Stack_130._M_pi._4_4_ = iVar5;
        local_118._0_1_ = false;
        local_118._1_1_ = false;
        if (iVar5 == (int)_Stack_130._M_pi) {
          local_128 = (char *)0x0;
          pcStack_120 = (char *)0x0;
          bVar15 = false;
          iVar5 = (int)_Stack_130._M_pi;
        }
        else {
          local_128 = *(char **)((long)local_138 + ((long)iVar4 * 2 + 2) * 4);
          if (*local_128 == '\0') {
            lVar11 = 0;
          }
          else {
            lVar13 = 0;
            do {
              lVar11 = lVar13 + 1;
              lVar2 = lVar13 + 1;
              lVar13 = lVar11;
            } while (local_128[lVar2] != '\0');
          }
          pcStack_120 = local_128 + lVar11;
          bVar15 = true;
        }
      }
    } while ((iVar5 != argc) || (bVar15));
    if (((int)local_110 != 0) || (iVar6 != 0 && iVar6 < 3)) {
      DumpParams::resolveLineFormat((DumpParams *)&local_d8);
      local_138 = (undefined1  [8])0x0;
      _Stack_130._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (local_108._M_string_length == 0) {
        plVar14 = (long *)0x0;
        this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_0010292a:
        DumpParams::applyFormat((DumpParams *)&local_d8,(ostream *)&std::cout);
        if (plVar14 == (long *)0x0) {
          puts("Nothing to do");
        }
        else {
          local_e8._first = (uchar *)(*plVar14 + plVar14[2]);
          local_e8._last = (uchar *)((long)local_e8._first + local_b8);
          Hex::operator<<((ostream *)&std::cout,&local_e8);
        }
        uVar12 = (uint)(plVar14 == (long *)0x0);
        if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
        }
      }
      else {
        iVar6 = open(local_108._M_dataplus._M_p,0);
        filehandle::operator=((filehandle *)local_138,iVar6);
        local_98 = filehandle::size((filehandle *)local_138);
        if (local_90 == '\0') {
          local_90 = '\x01';
        }
        bVar15 = DumpParams::resolveSizes((DumpParams *)&local_d8);
        uVar12 = 1;
        if (bVar15) {
          local_38 = local_d8._M_value - local_a8;
          local_40 = local_c8 - local_a8;
          local_44 = 1;
          local_e8._first = (uchar *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mappedmem,std::allocator<mappedmem>,filehandle&,long,long,int>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e8._last,
                     (mappedmem **)&local_e8,(allocator<mappedmem> *)&local_139,
                     (filehandle *)local_138,&local_38,&local_40,&local_44);
          this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._last;
          plVar14 = (long *)local_e8._first;
          goto LAB_0010292a;
        }
      }
      if (_Stack_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_130._M_pi);
      }
      goto LAB_0010299b;
    }
  }
switchD_001025cb_caseD_67:
  puts(
      "Usage: dump2 [opt] <infile> [outfile]\n        -b BASE    -- what offset to give the start of the file.\n        -o START   -- where to start dumping\n        -e END     -- where to end dumping\n        -l SIZE    -- how many bytes to dump\n        -w WIDTH   -- nr of items per line\n        -s STEP    -- how many bytes to skip between lines\n        -f         -- don\'t summarize, full dump\n        -S THRESH  -- summarize threshold\n        -x         -- only hex\n        -xx        -- only ascii\n        -1, -2, -4, -8  -- wordsize"
      );
  uVar12 = 1;
LAB_0010299b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,
                    CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                             local_108.field_2._M_local_buf[0]) + 1);
  }
  return uVar12;
}

Assistant:

int main(int argc, char**argv)
{
    std::string srcFilename;
    std::string dstFilename;
    DumpParams params;
    int processId = 0;

    int argsfound = 0; 
    for (auto& arg : ArgParser(argc, argv))
        switch(arg.option())
        {
          // options from 'dump', not yet implemented:
          //   -h  : dump hashes
          //   -ripemd160
          //   -sha1, -sha2, -sha3, -sha5, -sum
          //   -md5, -md2, -md4, -md160
          //   -a : strings
          //   -crc
          //   -c : raw selected data to stdout.
          //   -r SIZE  : specify readchunk
          //
          // todo: add choice of reading via stdio, or via mmap
          // todo: add choice of outputting a hexdump, rawdata, stringdump, to dstFilename

            case 'b': params.baseOffset = arg.getint(); break;  // the offset at file pos 0
            case 'o': params.offset = arg.getint(); break;
            case 'e': params.endOffset = arg.getint(); break;
            case 'l': params.length = arg.getint(); break;
            case 'p': processId = arg.getint(); break;

            case 'w': params.unitsPerLine = arg.getuint(); break;
            case 's': params.stepSize = arg.getuint(); break;
            case 'f': params.summarize = false; break;
            case 'S': params.summarizeThreshold = arg.getuint(); break;
            case 'x': if (arg.count()==2)
                          params.dumpformat = DUMP_ASCII; 
                      else
                          params.dumpformat = DUMP_HEX; 
                      break;
            case '1': case '2': case '4': case '8':
                params.dumpUnitSize = arg.option()-'0';
                break;

            case -1:
                switch (argsfound++) {
                    case 0: srcFilename = arg.getstr(); break;
                    case 1: dstFilename = arg.getstr(); break;
                }
                break;

            default:
                usage();
                return 1;
        }

    if (processId==0 && (argsfound==0 || argsfound>2))
    {
        usage();
        return 1;
    }

    params.resolveLineFormat();

    filehandle f;
#ifdef __MACH__
    std::shared_ptr<MachVirtualMemory> vmem;
#endif
    std::shared_ptr<mappedmem> mmem;

    if (!srcFilename.empty()) {
        f = open(srcFilename.c_str(), O_RDONLY);
        params.fileSize = f.size();

        if (!params.resolveSizes())
            return 1;
        mmem = std::make_shared<mappedmem>(f, *params.offset - *params.baseOffset, *params.endOffset - *params.baseOffset, PROT_READ);
    }
#ifdef __MACH__
    else if (processId) {
        try {
        task_t task = MachOpenProcessByPid(processId);
        vmem = std::make_shared<MachVirtualMemory>(task, *params.offset, *params.length);
        }
        catch(std::exception& e)
        {
            std::cout << "ERROR " << e.what() << "\n";
        }
    }
#endif

    params.applyFormat(std::cout);

    if (mmem)
        std::cout << Hex::dumper(mmem->data(), mmem->data()+*params.length);
#ifdef __MACH__
    else if (vmem)
        std::cout << Hex::dumper(vmem->begin(), vmem->end());
#endif
    else {
        printf("Nothing to do\n");
        return 1;
    }